

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_24::BinaryReader::PrintError(BinaryReader *this,char *format,...)

{
  size_t offset;
  BinaryReaderDelegate *pBVar1;
  _func_int *p_Var2;
  long lVar3;
  FILE *__stream;
  Offset OVar4;
  ErrorLevel EVar5;
  char in_AL;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__s;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_250;
  char acStack_248 [8];
  FILE *local_240;
  Offset local_238;
  ErrorLevel local_22c;
  BinaryReader *local_228;
  byte local_219;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  byte local_161;
  undefined1 auStack_160 [7];
  bool handled;
  Location local_150;
  undefined1 local_130 [8];
  Error error;
  size_t length;
  char *buffer;
  char fixed_buf [128];
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  ErrorLevel error_level;
  char *format_local;
  BinaryReader *this_local;
  
  __s = acStack_248;
  if (in_AL != '\0') {
    local_1e8 = in_XMM0_Da;
    local_1d8 = in_XMM1_Qa;
    local_1c8 = in_XMM2_Qa;
    local_1b8 = in_XMM3_Qa;
    local_1a8 = in_XMM4_Qa;
    local_198 = in_XMM5_Qa;
    local_188 = in_XMM6_Qa;
    local_178 = in_XMM7_Qa;
  }
  local_219 = 0;
  if ((this->reading_custom_section_ & 1U) != 0) {
    local_219 = this->options_->fail_on_custom_section_error ^ 0xff;
  }
  args[0].reg_save_area._4_4_ = (ErrorLevel)((local_219 & 1) == 0);
  args[0].overflow_arg_area = local_218;
  args[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  fixed_buf[0x78] = '\x10';
  fixed_buf[0x79] = '\0';
  fixed_buf[0x7a] = '\0';
  fixed_buf[0x7b] = '\0';
  fixed_buf[0x7c] = '0';
  fixed_buf[0x7d] = '\0';
  fixed_buf[0x7e] = '\0';
  fixed_buf[0x7f] = '\0';
  uStack_250 = 0x17e637;
  local_228 = this;
  local_208 = in_RDX;
  local_200 = in_RCX;
  local_1f8 = in_R8;
  local_1f0 = in_R9;
  iVar6 = vsnprintf((char *)&buffer,0x80,format,&uStack_38);
  error.message.field_2._8_8_ = SEXT48(iVar6);
  length = (size_t)&buffer;
  if (0x80 < error.message.field_2._8_8_ + 1) {
    lVar3 = -(error.message.field_2._8_8_ + 0x10 & 0xfffffffffffffff0);
    __s = acStack_248 + lVar3;
    __maxlen = error.message.field_2._8_8_ + 1;
    *(undefined8 *)((long)&uStack_250 + lVar3) = 0x17e695;
    iVar6 = vsnprintf(__s,__maxlen,format,fixed_buf + 0x78);
    error.message.field_2._8_8_ = SEXT48(iVar6);
    length = (size_t)__s;
  }
  local_22c = args[0].reg_save_area._4_4_;
  offset = (local_228->state_).offset;
  __s[-8] = -0x3e;
  __s[-7] = -0x1a;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  Location::Location(&local_150,offset);
  __s[-8] = -0x2b;
  __s[-7] = -0x1a;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_160,(char *)length);
  EVar5 = local_22c;
  *(size_t *)(__s + -0x20) = local_150.filename._M_len;
  *(char **)(__s + -0x18) = local_150.filename._M_str;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(__s + -0x10))->offset
       = (size_t)local_150.field_1.field_1.offset;
  *(undefined8 *)(__s + -8) = local_150.field_1._8_8_;
  __s[-0x28] = '\"';
  __s[-0x27] = -0x19;
  __s[-0x26] = '\x17';
  __s[-0x25] = '\0';
  __s[-0x24] = '\0';
  __s[-0x23] = '\0';
  __s[-0x22] = '\0';
  __s[-0x21] = '\0';
  Error::Error((Error *)local_130,EVar5,*(Location *)(__s + -0x20),_auStack_160);
  pBVar1 = local_228->delegate_;
  p_Var2 = pBVar1->_vptr_BinaryReaderDelegate[2];
  __s[-8] = '>';
  __s[-7] = -0x19;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  uVar7 = (*p_Var2)(pBVar1,local_130);
  EVar5 = args[0].reg_save_area._4_4_;
  local_161 = (byte)uVar7 & 1;
  if ((uVar7 & 1) == 0) {
    local_240 = _stderr;
    local_238 = (local_228->state_).offset;
    __s[-8] = 'z';
    __s[-7] = -0x19;
    __s[-6] = '\x17';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    pcVar8 = GetErrorLevelName(EVar5);
    OVar4 = local_238;
    __stream = local_240;
    __s[-8] = -0x60;
    __s[-7] = -0x19;
    __s[-6] = '\x17';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fprintf(__stream,"%07zx: %s: %s\n",OVar4,pcVar8,length);
  }
  __s[-8] = -0x54;
  __s[-7] = -0x19;
  __s[-6] = '\x17';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  Error::~Error((Error *)local_130);
  return;
}

Assistant:

BinaryReader::PrintError(const char* format,
                                                       ...) {
  ErrorLevel error_level =
      reading_custom_section_ && !options_.fail_on_custom_section_error
          ? ErrorLevel::Warning
          : ErrorLevel::Error;

  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  Error error(error_level, Location(state_.offset), buffer);
  bool handled = delegate_->OnError(error);

  if (!handled) {
    // Not great to just print, but we don't want to eat the error either.
    fprintf(stderr, "%07" PRIzx ": %s: %s\n", state_.offset,
            GetErrorLevelName(error_level), buffer);
  }
}